

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse_data.hpp
# Opt level: O1

pair<std::tuple<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
* __thiscall
Disa::insert<double,int,int>
          (pair<std::tuple<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
           *__return_storage_ptr__,Disa *this,CSR_Data<double,_int> *data,int *row,int *column,
          double *value)

{
  ostream *poVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  undefined8 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined **local_40;
  value_type_conflict1 *local_38;
  
  iVar5 = *(int *)&(data->row_offset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  if (iVar5 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_40 = &PTR_s__workspace_llm4binary_github_lic_001615c8;
    console_format_abi_cxx11_(&local_60,(Disa *)0x0,(Log_Level)&local_40,(source_location *)row);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Row index must be positive.",0x1b);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    if (-1 < *row) {
      iVar4 = 0;
      if (*(long *)(this + 8) != *(long *)this) {
        iVar4 = (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 2) + -1;
      }
      piVar6 = column;
      if (iVar4 <= iVar5) {
        local_60._M_dataplus._M_p._0_4_ = iVar5 + 1;
        local_40 = (undefined **)CONCAT44(local_40._4_4_,*(undefined4 *)(this + 0x48));
        resize<double,int,int>((CSR_Data<double,_int> *)this,(int *)&local_60,(int *)&local_40);
      }
      local_38 = (value_type_conflict1 *)column;
      if (*(int *)(this + 0x48) <= *row) {
        iVar5 = 0;
        if (*(long *)(this + 8) != *(long *)this) {
          iVar5 = (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 2) + -1;
        }
        local_60._M_dataplus._M_p._0_4_ = iVar5;
        local_40 = (undefined **)CONCAT44(local_40._4_4_,*row + 1);
        resize<double,int,int>((CSR_Data<double,_int> *)this,(int *)&local_60,(int *)&local_40);
      }
      uVar7 = (long)*(int *)&(data->row_offset).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start * 4 + *(long *)this;
      lower_bound<double,int,int>((type *)&local_60,this,data,row,piVar6);
      if ((local_60.field_2._M_allocated_capacity == uVar7) &&
         (*(int *)local_60._M_string_length == *row)) {
        bVar3 = false;
        uVar7 = local_60.field_2._M_allocated_capacity;
      }
      else {
        piVar6 = *(int **)(this + 8);
        piVar2 = (int *)uVar7;
        while (piVar2 = piVar2 + 1, piVar2 < piVar6) {
          *piVar2 = *piVar2 + 1;
        }
        local_60._M_string_length =
             (size_type)
             std::vector<int,_std::allocator<int>_>::insert
                       ((vector<int,_std::allocator<int>_> *)(this + 0x18),
                        (const_iterator)local_60._M_string_length,row);
        local_60._M_dataplus._M_p =
             (pointer)std::vector<double,_std::allocator<double>_>::insert
                                ((vector<double,_std::allocator<double>_> *)(this + 0x30),
                                 local_60._M_dataplus._M_p,local_38);
        bVar3 = true;
      }
      (__return_storage_ptr__->first).
      super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Tuple_impl<2UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Head_base<2UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
      ._M_head_impl._M_current = (double *)local_60._M_dataplus._M_p;
      (__return_storage_ptr__->first).
      super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Head_base<1UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
      ._M_head_impl._M_current = (int *)local_60._M_string_length;
      (__return_storage_ptr__->first).
      super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Head_base<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
      ._M_head_impl._M_current = (int *)uVar7;
      __return_storage_ptr__->second = bVar3;
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_40 = &PTR_s__workspace_llm4binary_github_lic_001615e0;
    console_format_abi_cxx11_(&local_60,(Disa *)0x0,(Log_Level)&local_40,(source_location *)row);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Columns index must be positive.",0x1f);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::__cxx11::string::~string((string *)&local_60);
  exit(1);
}

Assistant:

std::pair<typename CSR_Data<_value_type, _index_type>::iterator, bool> insert(CSR_Data<_value_type, _index_type>& data,
                                                                              const _arg_index_type& row,
                                                                              const _arg_index_type& column,
                                                                              const _value_type& value) {

  // Check sizes
  ASSERT_DEBUG(row >= 0, "Row index must be positive.");
  ASSERT_DEBUG(column >= 0, "Columns index must be positive.");

  // Resize if we need to.
  if(row >= size_row(data)) resize(data, row + 1, static_cast<_arg_index_type>(size_column(data)));
  if(column >= size_column(data)) resize(data, static_cast<_arg_index_type>(size_row(data)), column + 1);

  // Search for new insert
  const auto iter_row_start = data.row_offset.begin() + row;  // tricky, only create after resizing.
  auto [iter_row, iter_column, iter_value] = lower_bound(data, row, column);

  // Entry exists, return no insert.
  if(iter_row == iter_row_start && *iter_column == column)
    return {std::make_tuple(iter_row, iter_column, iter_value), false};

  // Insert new entry.
  for(auto non_zeros = iter_row_start + 1; non_zeros < data.row_offset.end(); ++(*non_zeros++)) {};  // increment and ++
  iter_column = data.i_column.insert(iter_column, column);
  iter_value = data.value.insert(iter_value, value);
  return {std::make_tuple(iter_row_start, iter_column, iter_value), true};
}